

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_1,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMiIntersectorKMoeller<4,_8,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<8> *ray,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  float **ppfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  RTCFilterFunctionN p_Var7;
  undefined1 auVar8 [32];
  undefined1 (*pauVar9) [16];
  byte bVar10;
  int iVar11;
  undefined4 uVar12;
  long lVar13;
  uint uVar14;
  ulong uVar16;
  Scene *pSVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  undefined1 (*pauVar23) [16];
  vint4 bi_1;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [64];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  vint4 bi;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  vint4 ai;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar48;
  float fVar49;
  float fVar50;
  undefined1 auVar47 [64];
  undefined1 auVar51 [16];
  undefined1 auVar52 [64];
  undefined1 auVar53 [16];
  uint uVar55;
  uint uVar56;
  uint uVar57;
  undefined1 auVar54 [64];
  undefined1 auVar58 [16];
  undefined1 auVar59 [64];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [64];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [64];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [64];
  vbool<4> valid;
  Scene *scene;
  RTCFilterFunctionNArguments args;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1300 [16];
  Scene *local_12e8;
  undefined1 local_12e0 [16];
  Geometry *local_12d0;
  ulong local_12c8;
  ulong local_12c0;
  long local_12b8;
  long local_12b0;
  ulong local_12a8;
  RTCFilterFunctionNArguments local_12a0;
  undefined8 local_1270;
  undefined8 uStack_1268;
  undefined1 local_1260 [32];
  undefined1 local_1240 [16];
  undefined1 local_1230 [16];
  undefined1 local_1220 [16];
  undefined1 local_1210 [16];
  undefined1 local_1200 [16];
  undefined1 local_11f0 [16];
  undefined1 local_11e0 [16];
  undefined1 local_11d0 [16];
  undefined1 local_11c0 [16];
  undefined8 local_11b0;
  undefined8 uStack_11a8;
  undefined1 local_11a0 [16];
  undefined1 local_1190 [16];
  undefined1 local_1180 [16];
  undefined1 local_1170 [16];
  undefined1 local_1150 [16];
  float local_1140 [4];
  float local_1130 [4];
  undefined1 local_1120 [16];
  undefined1 local_1110 [16];
  undefined1 local_1100 [16];
  undefined1 local_10f0 [16];
  undefined1 local_10e0 [32];
  RTCHitN local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  float local_1040;
  float fStack_103c;
  float fStack_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float fStack_1028;
  float fStack_1024;
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  uint local_fe0;
  uint uStack_fdc;
  uint uStack_fd8;
  uint uStack_fd4;
  uint uStack_fd0;
  uint uStack_fcc;
  uint uStack_fc8;
  uint uStack_fc4;
  uint local_fc0;
  uint uStack_fbc;
  uint uStack_fb8;
  uint uStack_fb4;
  uint uStack_fb0;
  uint uStack_fac;
  uint uStack_fa8;
  uint uStack_fa4;
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  ulong uVar15;
  undefined1 auVar37 [32];
  undefined1 auVar40 [32];
  
  pauVar23 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  fVar44 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar72 = ZEXT1664(CONCAT412(fVar44,CONCAT48(fVar44,CONCAT44(fVar44,fVar44))));
  fVar48 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_11c0._4_4_ = fVar48;
  local_11c0._0_4_ = fVar48;
  local_11c0._8_4_ = fVar48;
  local_11c0._12_4_ = fVar48;
  auVar47 = ZEXT1664(local_11c0);
  fVar49 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  local_11d0._4_4_ = fVar49;
  local_11d0._0_4_ = fVar49;
  local_11d0._8_4_ = fVar49;
  local_11d0._12_4_ = fVar49;
  auVar52 = ZEXT1664(local_11d0);
  fVar44 = fVar44 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar48 = fVar48 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar49 = fVar49 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  uVar20 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar19 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar18 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  local_12a8 = uVar20 ^ 0x10;
  iVar11 = (tray->tfar).field_0.i[k];
  auVar27 = ZEXT1664(CONCAT412(iVar11,CONCAT48(iVar11,CONCAT44(iVar11,iVar11))));
  local_11e0._8_4_ = 0x80000000;
  local_11e0._0_8_ = 0x8000000080000000;
  local_11e0._12_4_ = 0x80000000;
  local_11f0._0_8_ = CONCAT44(fVar44,fVar44) ^ 0x8000000080000000;
  local_11f0._8_4_ = -fVar44;
  local_11f0._12_4_ = -fVar44;
  auVar54 = ZEXT1664(local_11f0);
  local_1200._0_8_ = CONCAT44(fVar48,fVar48) ^ 0x8000000080000000;
  local_1200._8_4_ = -fVar48;
  local_1200._12_4_ = -fVar48;
  auVar59 = ZEXT1664(local_1200);
  local_1210._0_8_ = CONCAT44(fVar49,fVar49) ^ 0x8000000080000000;
  local_1210._8_4_ = -fVar49;
  local_1210._12_4_ = -fVar49;
  auVar62 = ZEXT1664(local_1210);
  iVar11 = (tray->tnear).field_0.i[k];
  local_1220._4_4_ = iVar11;
  local_1220._0_4_ = iVar11;
  local_1220._8_4_ = iVar11;
  local_1220._12_4_ = iVar11;
  auVar65 = ZEXT1664(local_1220);
  iVar11 = 1 << ((uint)k & 0x1f);
  auVar33._4_4_ = iVar11;
  auVar33._0_4_ = iVar11;
  auVar33._8_4_ = iVar11;
  auVar33._12_4_ = iVar11;
  auVar33._16_4_ = iVar11;
  auVar33._20_4_ = iVar11;
  auVar33._24_4_ = iVar11;
  auVar33._28_4_ = iVar11;
  auVar37 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar33 = vpand_avx2(auVar33,auVar37);
  local_10e0 = vpcmpeqd_avx2(auVar33,auVar37);
LAB_015e2f7b:
  do {
    do {
      if (pauVar23 == (undefined1 (*) [16])&local_fa0) {
        return;
      }
      pauVar9 = pauVar23 + -1;
      pauVar23 = pauVar23 + -1;
    } while (*(float *)(ray + k * 4 + 0x100) < *(float *)(*pauVar9 + 8));
    uVar22 = *(ulong *)*pauVar23;
    while ((uVar22 & 8) == 0) {
      auVar28 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar22 + 0x20 + uVar20),auVar54._0_16_,
                                auVar72._0_16_);
      auVar34 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar22 + 0x20 + uVar19),auVar59._0_16_,
                                auVar47._0_16_);
      auVar28 = vpmaxsd_avx(auVar28,auVar34);
      auVar34 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar22 + 0x20 + uVar18),auVar62._0_16_,
                                auVar52._0_16_);
      auVar34 = vpmaxsd_avx(auVar34,auVar65._0_16_);
      auVar34 = vpmaxsd_avx(auVar28,auVar34);
      auVar28 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar22 + 0x20 + local_12a8),auVar54._0_16_,
                                auVar72._0_16_);
      auVar38 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar22 + 0x20 + (uVar19 ^ 0x10)),
                                auVar59._0_16_,auVar47._0_16_);
      auVar28 = vpminsd_avx(auVar28,auVar38);
      auVar38 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar22 + 0x20 + (uVar18 ^ 0x10)),
                                auVar62._0_16_,auVar52._0_16_);
      auVar38 = vpminsd_avx(auVar38,auVar27._0_16_);
      auVar28 = vpminsd_avx(auVar28,auVar38);
      auVar28 = vpcmpgtd_avx(auVar34,auVar28);
      iVar11 = vmovmskps_avx(auVar28);
      local_10c0[0] = (RTCHitN)auVar34[0];
      local_10c0[1] = (RTCHitN)auVar34[1];
      local_10c0[2] = (RTCHitN)auVar34[2];
      local_10c0[3] = (RTCHitN)auVar34[3];
      local_10c0[4] = (RTCHitN)auVar34[4];
      local_10c0[5] = (RTCHitN)auVar34[5];
      local_10c0[6] = (RTCHitN)auVar34[6];
      local_10c0[7] = (RTCHitN)auVar34[7];
      local_10c0[8] = (RTCHitN)auVar34[8];
      local_10c0[9] = (RTCHitN)auVar34[9];
      local_10c0[10] = (RTCHitN)auVar34[10];
      local_10c0[0xb] = (RTCHitN)auVar34[0xb];
      local_10c0[0xc] = (RTCHitN)auVar34[0xc];
      local_10c0[0xd] = (RTCHitN)auVar34[0xd];
      local_10c0[0xe] = (RTCHitN)auVar34[0xe];
      local_10c0[0xf] = (RTCHitN)auVar34[0xf];
      if (iVar11 == 0xf) goto LAB_015e2f7b;
      bVar10 = (byte)iVar11 ^ 0xf;
      uVar21 = uVar22 & 0xfffffffffffffff0;
      lVar13 = 0;
      for (uVar22 = (ulong)bVar10; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
        lVar13 = lVar13 + 1;
      }
      uVar22 = *(ulong *)(uVar21 + lVar13 * 8);
      uVar14 = bVar10 - 1 & (uint)bVar10;
      uVar15 = (ulong)uVar14;
      if (uVar14 != 0) {
        uVar55 = *(uint *)(local_10c0 + lVar13 * 4);
        lVar13 = 0;
        for (; (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
          lVar13 = lVar13 + 1;
        }
        uVar14 = uVar14 - 1 & uVar14;
        uVar16 = (ulong)uVar14;
        uVar15 = *(ulong *)(uVar21 + lVar13 * 8);
        uVar56 = *(uint *)(local_10c0 + lVar13 * 4);
        if (uVar14 == 0) {
          if (uVar55 < uVar56) {
            *(ulong *)*pauVar23 = uVar15;
            *(uint *)(*pauVar23 + 8) = uVar56;
            pauVar23 = pauVar23 + 1;
          }
          else {
            *(ulong *)*pauVar23 = uVar22;
            *(uint *)(*pauVar23 + 8) = uVar55;
            uVar22 = uVar15;
            pauVar23 = pauVar23 + 1;
          }
        }
        else {
          auVar28._8_8_ = 0;
          auVar28._0_8_ = uVar22;
          auVar28 = vpunpcklqdq_avx(auVar28,ZEXT416(uVar55));
          auVar34._8_8_ = 0;
          auVar34._0_8_ = uVar15;
          auVar34 = vpunpcklqdq_avx(auVar34,ZEXT416(uVar56));
          lVar13 = 0;
          for (; (uVar16 & 1) == 0; uVar16 = uVar16 >> 1 | 0x8000000000000000) {
            lVar13 = lVar13 + 1;
          }
          uVar14 = uVar14 - 1 & uVar14;
          uVar22 = (ulong)uVar14;
          auVar38._8_8_ = 0;
          auVar38._0_8_ = *(ulong *)(uVar21 + lVar13 * 8);
          auVar46 = vpunpcklqdq_avx(auVar38,ZEXT416(*(uint *)(local_10c0 + lVar13 * 4)));
          auVar38 = vpcmpgtd_avx(auVar34,auVar28);
          if (uVar14 == 0) {
            auVar41 = vpshufd_avx(auVar38,0xaa);
            auVar38 = vblendvps_avx(auVar34,auVar28,auVar41);
            auVar28 = vblendvps_avx(auVar28,auVar34,auVar41);
            auVar34 = vpcmpgtd_avx(auVar46,auVar38);
            auVar41 = vpshufd_avx(auVar34,0xaa);
            auVar34 = vblendvps_avx(auVar46,auVar38,auVar41);
            auVar38 = vblendvps_avx(auVar38,auVar46,auVar41);
            auVar46 = vpcmpgtd_avx(auVar38,auVar28);
            auVar41 = vpshufd_avx(auVar46,0xaa);
            auVar46 = vblendvps_avx(auVar38,auVar28,auVar41);
            auVar28 = vblendvps_avx(auVar28,auVar38,auVar41);
            *pauVar23 = auVar28;
            pauVar23[1] = auVar46;
            uVar22 = auVar34._0_8_;
            pauVar23 = pauVar23 + 2;
          }
          else {
            lVar13 = 0;
            for (; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
              lVar13 = lVar13 + 1;
            }
            auVar41._8_8_ = 0;
            auVar41._0_8_ = *(ulong *)(uVar21 + lVar13 * 8);
            auVar53 = vpunpcklqdq_avx(auVar41,ZEXT416(*(uint *)(local_10c0 + lVar13 * 4)));
            auVar41 = vpshufd_avx(auVar38,0xaa);
            auVar38 = vblendvps_avx(auVar34,auVar28,auVar41);
            auVar28 = vblendvps_avx(auVar28,auVar34,auVar41);
            auVar34 = vpcmpgtd_avx(auVar53,auVar46);
            auVar41 = vpshufd_avx(auVar34,0xaa);
            auVar34 = vblendvps_avx(auVar53,auVar46,auVar41);
            auVar46 = vblendvps_avx(auVar46,auVar53,auVar41);
            auVar41 = vpcmpgtd_avx(auVar46,auVar28);
            auVar53 = vpshufd_avx(auVar41,0xaa);
            auVar41 = vblendvps_avx(auVar46,auVar28,auVar53);
            auVar28 = vblendvps_avx(auVar28,auVar46,auVar53);
            auVar46 = vpcmpgtd_avx(auVar34,auVar38);
            auVar53 = vpshufd_avx(auVar46,0xaa);
            auVar46 = vblendvps_avx(auVar34,auVar38,auVar53);
            auVar34 = vblendvps_avx(auVar38,auVar34,auVar53);
            auVar38 = vpcmpgtd_avx(auVar41,auVar34);
            auVar53 = vpshufd_avx(auVar38,0xaa);
            auVar38 = vblendvps_avx(auVar41,auVar34,auVar53);
            auVar34 = vblendvps_avx(auVar34,auVar41,auVar53);
            *pauVar23 = auVar28;
            pauVar23[1] = auVar34;
            pauVar23[2] = auVar38;
            uVar22 = auVar46._0_8_;
            pauVar23 = pauVar23 + 3;
          }
        }
      }
    }
    local_12b0 = (ulong)((uint)uVar22 & 0xf) - 8;
    uVar22 = uVar22 & 0xfffffffffffffff0;
    for (local_12b8 = 0; local_12b8 != local_12b0; local_12b8 = local_12b8 + 1) {
      lVar13 = local_12b8 * 0x50;
      pSVar17 = context->scene;
      ppfVar2 = (pSVar17->vertices).items;
      pfVar3 = ppfVar2[*(uint *)(uVar22 + 0x30 + lVar13)];
      pfVar4 = ppfVar2[*(uint *)(uVar22 + 0x34 + lVar13)];
      pfVar5 = ppfVar2[*(uint *)(uVar22 + 0x38 + lVar13)];
      pfVar6 = ppfVar2[*(uint *)(uVar22 + 0x3c + lVar13)];
      auVar38 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar3 + *(uint *)(uVar22 + lVar13)),
                              *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar22 + 8 + lVar13)));
      auVar28 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar3 + *(uint *)(uVar22 + lVar13)),
                              *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar22 + 8 + lVar13)));
      auVar46 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar22 + 4 + lVar13)),
                              *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar22 + 0xc + lVar13)));
      auVar34 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar22 + 4 + lVar13)),
                              *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar22 + 0xc + lVar13)));
      auVar30 = vunpcklps_avx(auVar28,auVar34);
      auVar35 = vunpcklps_avx(auVar38,auVar46);
      auVar43 = vunpckhps_avx(auVar38,auVar46);
      auVar38 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar3 + *(uint *)(uVar22 + 0x10 + lVar13)),
                              *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar22 + 0x18 + lVar13)));
      auVar28 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar3 + *(uint *)(uVar22 + 0x10 + lVar13)),
                              *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar22 + 0x18 + lVar13)));
      auVar46 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar22 + 0x14 + lVar13)),
                              *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar22 + 0x1c + lVar13)));
      auVar34 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar22 + 0x14 + lVar13)),
                              *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar22 + 0x1c + lVar13)));
      auVar53 = vunpcklps_avx(auVar28,auVar34);
      auVar24 = vunpcklps_avx(auVar38,auVar46);
      auVar28 = vunpckhps_avx(auVar38,auVar46);
      auVar46 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar3 + *(uint *)(uVar22 + 0x20 + lVar13)),
                              *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar22 + 0x28 + lVar13)));
      auVar34 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar3 + *(uint *)(uVar22 + 0x20 + lVar13)),
                              *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar22 + 0x28 + lVar13)));
      auVar41 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar22 + 0x24 + lVar13)),
                              *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar22 + 0x2c + lVar13)));
      auVar38 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar22 + 0x24 + lVar13)),
                              *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar22 + 0x2c + lVar13)));
      auVar29 = vunpcklps_avx(auVar34,auVar38);
      auVar45 = vunpcklps_avx(auVar46,auVar41);
      auVar41 = vunpckhps_avx(auVar46,auVar41);
      puVar1 = (undefined8 *)(uVar22 + 0x30 + lVar13);
      local_11b0 = *puVar1;
      uStack_11a8 = puVar1[1];
      puVar1 = (undefined8 *)(uVar22 + 0x40 + lVar13);
      local_1270 = *puVar1;
      uStack_1268 = puVar1[1];
      auVar34 = vsubps_avx(auVar35,auVar24);
      auVar28 = vsubps_avx(auVar43,auVar28);
      auVar38 = vsubps_avx(auVar30,auVar53);
      auVar46 = vsubps_avx(auVar45,auVar35);
      auVar41 = vsubps_avx(auVar41,auVar43);
      auVar53 = vsubps_avx(auVar29,auVar30);
      auVar24._0_4_ = auVar53._0_4_ * auVar28._0_4_;
      auVar24._4_4_ = auVar53._4_4_ * auVar28._4_4_;
      auVar24._8_4_ = auVar53._8_4_ * auVar28._8_4_;
      auVar24._12_4_ = auVar53._12_4_ * auVar28._12_4_;
      local_1110 = vfmsub231ps_fma(auVar24,auVar41,auVar38);
      auVar29._0_4_ = auVar38._0_4_ * auVar46._0_4_;
      auVar29._4_4_ = auVar38._4_4_ * auVar46._4_4_;
      auVar29._8_4_ = auVar38._8_4_ * auVar46._8_4_;
      auVar29._12_4_ = auVar38._12_4_ * auVar46._12_4_;
      local_1100 = vfmsub231ps_fma(auVar29,auVar53,auVar34);
      uVar12 = *(undefined4 *)(ray + k * 4);
      auVar63._4_4_ = uVar12;
      auVar63._0_4_ = uVar12;
      auVar63._8_4_ = uVar12;
      auVar63._12_4_ = uVar12;
      uVar12 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar66._4_4_ = uVar12;
      auVar66._0_4_ = uVar12;
      auVar66._8_4_ = uVar12;
      auVar66._12_4_ = uVar12;
      uVar12 = *(undefined4 *)(ray + k * 4 + 0x40);
      auVar69._4_4_ = uVar12;
      auVar69._0_4_ = uVar12;
      auVar69._8_4_ = uVar12;
      auVar69._12_4_ = uVar12;
      fVar44 = *(float *)(ray + k * 4 + 0x80);
      auVar58._4_4_ = fVar44;
      auVar58._0_4_ = fVar44;
      auVar58._8_4_ = fVar44;
      auVar58._12_4_ = fVar44;
      auVar35 = vsubps_avx(auVar35,auVar63);
      fVar48 = *(float *)(ray + k * 4 + 0xa0);
      auVar64._4_4_ = fVar48;
      auVar64._0_4_ = fVar48;
      auVar64._8_4_ = fVar48;
      auVar64._12_4_ = fVar48;
      auVar43 = vsubps_avx(auVar43,auVar66);
      fVar49 = *(float *)(ray + k * 4 + 0xc0);
      auVar67._4_4_ = fVar49;
      auVar67._0_4_ = fVar49;
      auVar67._8_4_ = fVar49;
      auVar67._12_4_ = fVar49;
      auVar30 = vsubps_avx(auVar30,auVar69);
      auVar70._0_4_ = fVar44 * auVar43._0_4_;
      auVar70._4_4_ = fVar44 * auVar43._4_4_;
      auVar70._8_4_ = fVar44 * auVar43._8_4_;
      auVar70._12_4_ = fVar44 * auVar43._12_4_;
      auVar24 = vfmsub231ps_fma(auVar70,auVar35,auVar64);
      auVar60._0_4_ = auVar53._0_4_ * auVar24._0_4_;
      auVar60._4_4_ = auVar53._4_4_ * auVar24._4_4_;
      auVar60._8_4_ = auVar53._8_4_ * auVar24._8_4_;
      auVar60._12_4_ = auVar53._12_4_ * auVar24._12_4_;
      auVar71._0_4_ = auVar38._0_4_ * auVar24._0_4_;
      auVar71._4_4_ = auVar38._4_4_ * auVar24._4_4_;
      auVar71._8_4_ = auVar38._8_4_ * auVar24._8_4_;
      auVar71._12_4_ = auVar38._12_4_ * auVar24._12_4_;
      auVar53._0_4_ = fVar49 * auVar35._0_4_;
      auVar53._4_4_ = fVar49 * auVar35._4_4_;
      auVar53._8_4_ = fVar49 * auVar35._8_4_;
      auVar53._12_4_ = fVar49 * auVar35._12_4_;
      auVar53 = vfmsub231ps_fma(auVar53,auVar30,auVar58);
      auVar38 = vfmadd231ps_fma(auVar60,auVar53,auVar41);
      auVar53 = vfmadd231ps_fma(auVar71,auVar28,auVar53);
      auVar51._0_4_ = auVar41._0_4_ * auVar34._0_4_;
      auVar51._4_4_ = auVar41._4_4_ * auVar34._4_4_;
      auVar51._8_4_ = auVar41._8_4_ * auVar34._8_4_;
      auVar51._12_4_ = auVar41._12_4_ * auVar34._12_4_;
      local_10f0 = vfmsub231ps_fma(auVar51,auVar46,auVar28);
      auVar45._0_4_ = fVar48 * auVar30._0_4_;
      auVar45._4_4_ = fVar48 * auVar30._4_4_;
      auVar45._8_4_ = fVar48 * auVar30._8_4_;
      auVar45._12_4_ = fVar48 * auVar30._12_4_;
      auVar24 = vfmsub231ps_fma(auVar45,auVar43,auVar67);
      auVar68._0_4_ = local_10f0._0_4_ * fVar49;
      auVar68._4_4_ = local_10f0._4_4_ * fVar49;
      auVar68._8_4_ = local_10f0._8_4_ * fVar49;
      auVar68._12_4_ = local_10f0._12_4_ * fVar49;
      auVar28 = vfmadd231ps_fma(auVar68,local_1100,auVar64);
      auVar41 = vfmadd231ps_fma(auVar28,local_1110,auVar58);
      auVar38 = vfmadd231ps_fma(auVar38,auVar24,auVar46);
      auVar28 = vandps_avx(auVar41,local_11e0);
      uVar14 = auVar28._0_4_;
      local_11a0._0_4_ = (float)(uVar14 ^ auVar38._0_4_);
      uVar55 = auVar28._4_4_;
      local_11a0._4_4_ = (float)(uVar55 ^ auVar38._4_4_);
      uVar56 = auVar28._8_4_;
      local_11a0._8_4_ = (float)(uVar56 ^ auVar38._8_4_);
      uVar57 = auVar28._12_4_;
      local_11a0._12_4_ = (float)(uVar57 ^ auVar38._12_4_);
      auVar28 = vfmadd231ps_fma(auVar53,auVar34,auVar24);
      local_1190._0_4_ = (float)(uVar14 ^ auVar28._0_4_);
      local_1190._4_4_ = (float)(uVar55 ^ auVar28._4_4_);
      local_1190._8_4_ = (float)(uVar56 ^ auVar28._8_4_);
      local_1190._12_4_ = (float)(uVar57 ^ auVar28._12_4_);
      auVar38 = ZEXT816(0) << 0x20;
      auVar28 = vcmpps_avx(local_11a0,auVar38,5);
      auVar34 = vcmpps_avx(local_1190,auVar38,5);
      auVar28 = vandps_avx(auVar34,auVar28);
      auVar46._8_4_ = 0x7fffffff;
      auVar46._0_8_ = 0x7fffffff7fffffff;
      auVar46._12_4_ = 0x7fffffff;
      local_1170 = vandps_avx(auVar41,auVar46);
      auVar34 = vcmpps_avx(auVar41,auVar38,4);
      auVar28 = vandps_avx(auVar28,auVar34);
      auVar61._0_4_ = local_11a0._0_4_ + local_1190._0_4_;
      auVar61._4_4_ = local_11a0._4_4_ + local_1190._4_4_;
      auVar61._8_4_ = local_11a0._8_4_ + local_1190._8_4_;
      auVar61._12_4_ = local_11a0._12_4_ + local_1190._12_4_;
      auVar34 = vcmpps_avx(auVar61,local_1170,2);
      auVar38 = auVar34 & auVar28;
      if ((((auVar38 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar38 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar38 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar38[0xf] < '\0'
         ) {
        auVar28 = vandps_avx(auVar28,auVar34);
        auVar42._0_4_ = local_10f0._0_4_ * auVar30._0_4_;
        auVar42._4_4_ = local_10f0._4_4_ * auVar30._4_4_;
        auVar42._8_4_ = local_10f0._8_4_ * auVar30._8_4_;
        auVar42._12_4_ = local_10f0._12_4_ * auVar30._12_4_;
        auVar34 = vfmadd213ps_fma(auVar43,local_1100,auVar42);
        auVar34 = vfmadd213ps_fma(auVar35,local_1110,auVar34);
        local_1180._0_4_ = (float)(uVar14 ^ auVar34._0_4_);
        local_1180._4_4_ = (float)(uVar55 ^ auVar34._4_4_);
        local_1180._8_4_ = (float)(uVar56 ^ auVar34._8_4_);
        local_1180._12_4_ = (float)(uVar57 ^ auVar34._12_4_);
        fVar44 = *(float *)(ray + k * 4 + 0x60);
        auVar35._0_4_ = local_1170._0_4_ * fVar44;
        auVar35._4_4_ = local_1170._4_4_ * fVar44;
        auVar35._8_4_ = local_1170._8_4_ * fVar44;
        auVar35._12_4_ = local_1170._12_4_ * fVar44;
        auVar34 = vcmpps_avx(auVar35,local_1180,1);
        fVar44 = *(float *)(ray + k * 4 + 0x100);
        auVar27 = ZEXT1664(CONCAT412(fVar44,CONCAT48(fVar44,CONCAT44(fVar44,fVar44))));
        auVar43._0_4_ = fVar44 * local_1170._0_4_;
        auVar43._4_4_ = fVar44 * local_1170._4_4_;
        auVar43._8_4_ = fVar44 * local_1170._8_4_;
        auVar43._12_4_ = fVar44 * local_1170._12_4_;
        auVar38 = vcmpps_avx(local_1180,auVar43,2);
        auVar34 = vandps_avx(auVar34,auVar38);
        auVar38 = auVar28 & auVar34;
        if ((((auVar38 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar38 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar38 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar38[0xf] < '\0') {
          local_1300 = vandps_avx(auVar28,auVar34);
          local_1150 = local_1300;
          auVar28 = vrcpps_avx(local_1170);
          auVar30._8_4_ = 0x3f800000;
          auVar30._0_8_ = 0x3f8000003f800000;
          auVar30._12_4_ = 0x3f800000;
          auVar34 = vfnmadd213ps_fma(local_1170,auVar28,auVar30);
          auVar28 = vfmadd132ps_fma(auVar34,auVar28,auVar28);
          fVar44 = auVar28._0_4_;
          local_1120._0_4_ = fVar44 * local_1180._0_4_;
          fVar48 = auVar28._4_4_;
          local_1120._4_4_ = fVar48 * local_1180._4_4_;
          fVar49 = auVar28._8_4_;
          local_1120._8_4_ = fVar49 * local_1180._8_4_;
          fVar50 = auVar28._12_4_;
          local_1120._12_4_ = fVar50 * local_1180._12_4_;
          auVar47 = ZEXT1664(local_1120);
          local_1140[0] = fVar44 * local_11a0._0_4_;
          local_1140[1] = fVar48 * local_11a0._4_4_;
          local_1140[2] = fVar49 * local_11a0._8_4_;
          local_1140[3] = fVar50 * local_11a0._12_4_;
          auVar31._8_4_ = 0x7f800000;
          auVar31._0_8_ = 0x7f8000007f800000;
          auVar31._12_4_ = 0x7f800000;
          auVar28 = vblendvps_avx(auVar31,local_1120,local_1300);
          local_1130[0] = fVar44 * local_1190._0_4_;
          local_1130[1] = fVar48 * local_1190._4_4_;
          local_1130[2] = fVar49 * local_1190._8_4_;
          local_1130[3] = fVar50 * local_1190._12_4_;
          auVar34 = vshufps_avx(auVar28,auVar28,0xb1);
          auVar34 = vminps_avx(auVar34,auVar28);
          auVar38 = vshufpd_avx(auVar34,auVar34,1);
          auVar34 = vminps_avx(auVar38,auVar34);
          auVar28 = vcmpps_avx(auVar28,auVar34,0);
          auVar38 = local_1300 & auVar28;
          auVar34 = vpcmpeqd_avx(auVar34,auVar34);
          if ((((auVar38 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar38 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar38 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar38[0xf] < '\0') {
            auVar34 = auVar28;
          }
          auVar28 = vandps_avx(local_1300,auVar34);
          uVar12 = vmovmskps_avx(auVar28);
          local_12c8 = 0;
          for (uVar21 = CONCAT44((int)((ulong)ray >> 0x20),uVar12); local_12e8 = pSVar17,
              (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000) {
            local_12c8 = local_12c8 + 1;
          }
          do {
            local_12e0 = auVar27._0_16_;
            uVar14 = *(uint *)((long)&local_11b0 + local_12c8 * 4);
            uVar21 = (ulong)uVar14;
            local_12d0 = (pSVar17->geometries).items[uVar21].ptr;
            if ((local_12d0->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
              *(undefined4 *)(local_1300 + local_12c8 * 4) = 0;
            }
            else {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (local_12d0->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar44 = local_1140[local_12c8];
                fVar48 = local_1130[local_12c8];
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_1120 + local_12c8 * 4);
                *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)(local_1110 + local_12c8 * 4);
                *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)(local_1100 + local_12c8 * 4);
                *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)(local_10f0 + local_12c8 * 4);
                *(float *)(ray + k * 4 + 0x1e0) = fVar44;
                *(float *)(ray + k * 4 + 0x200) = fVar48;
                *(undefined4 *)(ray + k * 4 + 0x220) =
                     *(undefined4 *)((long)&local_1270 + local_12c8 * 4);
                *(uint *)(ray + k * 4 + 0x240) = uVar14;
                *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                break;
              }
              local_1240 = auVar47._0_16_;
              local_1230 = auVar72._0_16_;
              fVar44 = local_1140[local_12c8];
              local_1060._4_4_ = fVar44;
              local_1060._0_4_ = fVar44;
              local_1060._8_4_ = fVar44;
              local_1060._12_4_ = fVar44;
              local_1060._16_4_ = fVar44;
              local_1060._20_4_ = fVar44;
              local_1060._24_4_ = fVar44;
              local_1060._28_4_ = fVar44;
              local_1040 = local_1130[local_12c8];
              uVar12 = *(undefined4 *)((long)&local_1270 + local_12c8 * 4);
              auVar39._4_4_ = uVar12;
              auVar39._0_4_ = uVar12;
              auVar39._8_4_ = uVar12;
              auVar39._12_4_ = uVar12;
              auVar40._16_4_ = uVar12;
              auVar40._0_16_ = auVar39;
              auVar40._20_4_ = uVar12;
              auVar40._24_4_ = uVar12;
              auVar40._28_4_ = uVar12;
              local_10c0._4_4_ = *(undefined4 *)(local_1110 + local_12c8 * 4);
              uVar12 = *(undefined4 *)(local_1100 + local_12c8 * 4);
              local_10a0._4_4_ = uVar12;
              local_10a0._0_4_ = uVar12;
              local_10a0._8_4_ = uVar12;
              local_10a0._12_4_ = uVar12;
              local_10a0._16_4_ = uVar12;
              local_10a0._20_4_ = uVar12;
              local_10a0._24_4_ = uVar12;
              local_10a0._28_4_ = uVar12;
              uVar12 = *(undefined4 *)(local_10f0 + local_12c8 * 4);
              local_1080._4_4_ = uVar12;
              local_1080._0_4_ = uVar12;
              local_1080._8_4_ = uVar12;
              local_1080._12_4_ = uVar12;
              local_1080._16_4_ = uVar12;
              local_1080._20_4_ = uVar12;
              local_1080._24_4_ = uVar12;
              local_1080._28_4_ = uVar12;
              auVar36._4_4_ = uVar14;
              auVar36._0_4_ = uVar14;
              auVar36._8_4_ = uVar14;
              auVar36._12_4_ = uVar14;
              auVar37._16_4_ = uVar14;
              auVar37._0_16_ = auVar36;
              auVar37._20_4_ = uVar14;
              auVar37._24_4_ = uVar14;
              auVar37._28_4_ = uVar14;
              local_10c0._0_4_ = local_10c0._4_4_;
              local_10c0._8_4_ = local_10c0._4_4_;
              local_10c0._12_4_ = local_10c0._4_4_;
              local_10c0[0x10] = (RTCHitN)(char)local_10c0._4_4_;
              local_10c0[0x11] = (RTCHitN)(char)((uint)local_10c0._4_4_ >> 8);
              local_10c0[0x12] = (RTCHitN)(char)((uint)local_10c0._4_4_ >> 0x10);
              local_10c0[0x13] = (RTCHitN)(char)((uint)local_10c0._4_4_ >> 0x18);
              local_10c0[0x14] = (RTCHitN)(char)local_10c0._4_4_;
              local_10c0[0x15] = (RTCHitN)(char)((uint)local_10c0._4_4_ >> 8);
              local_10c0[0x16] = (RTCHitN)(char)((uint)local_10c0._4_4_ >> 0x10);
              local_10c0[0x17] = (RTCHitN)(char)((uint)local_10c0._4_4_ >> 0x18);
              local_10c0[0x18] = (RTCHitN)(char)local_10c0._4_4_;
              local_10c0[0x19] = (RTCHitN)(char)((uint)local_10c0._4_4_ >> 8);
              local_10c0[0x1a] = (RTCHitN)(char)((uint)local_10c0._4_4_ >> 0x10);
              local_10c0[0x1b] = (RTCHitN)(char)((uint)local_10c0._4_4_ >> 0x18);
              local_10c0[0x1c] = (RTCHitN)(char)local_10c0._4_4_;
              local_10c0[0x1d] = (RTCHitN)(char)((uint)local_10c0._4_4_ >> 8);
              local_10c0[0x1e] = (RTCHitN)(char)((uint)local_10c0._4_4_ >> 0x10);
              local_10c0[0x1f] = (RTCHitN)(char)((uint)local_10c0._4_4_ >> 0x18);
              fStack_103c = local_1040;
              fStack_1038 = local_1040;
              fStack_1034 = local_1040;
              fStack_1030 = local_1040;
              fStack_102c = local_1040;
              fStack_1028 = local_1040;
              fStack_1024 = local_1040;
              local_1020 = auVar40;
              local_1000 = auVar37;
              vpcmpeqd_avx2(local_1060,local_1060);
              uStack_fdc = context->user->instID[0];
              local_fe0 = uStack_fdc;
              uStack_fd8 = uStack_fdc;
              uStack_fd4 = uStack_fdc;
              uStack_fd0 = uStack_fdc;
              uStack_fcc = uStack_fdc;
              uStack_fc8 = uStack_fdc;
              uStack_fc4 = uStack_fdc;
              uStack_fbc = context->user->instPrimID[0];
              local_fc0 = uStack_fbc;
              uStack_fb8 = uStack_fbc;
              uStack_fb4 = uStack_fbc;
              uStack_fb0 = uStack_fbc;
              uStack_fac = uStack_fbc;
              uStack_fa8 = uStack_fbc;
              uStack_fa4 = uStack_fbc;
              *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_1120 + local_12c8 * 4);
              local_1260 = local_10e0;
              local_12a0.valid = (int *)local_1260;
              local_12a0.geometryUserPtr = local_12d0->userPtr;
              local_12a0.context = context->user;
              local_12a0.hit = local_10c0;
              local_12a0.N = 8;
              local_12c0 = uVar20;
              local_12a0.ray = (RTCRayN *)ray;
              if (local_12d0->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                auVar37 = ZEXT1632(auVar36);
                auVar40 = ZEXT1632(auVar39);
                (*local_12d0->intersectionFilterN)(&local_12a0);
              }
              auVar26 = vpcmpeqd_avx2(local_1260,_DAT_01f7b000);
              auVar33 = _DAT_01f7b020 & ~auVar26;
              if ((((((((auVar33 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar33 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar33 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar33 >> 0x7f,0) == '\0') &&
                    (auVar33 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar33 >> 0xbf,0) == '\0') &&
                  (auVar33 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar33[0x1f]) {
                auVar26 = auVar26 ^ _DAT_01f7b020;
              }
              else {
                p_Var7 = context->args->filter;
                if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                    (((local_12d0->field_8).field_0x2 & 0x40) != 0)))) {
                  auVar37 = ZEXT1632(auVar37._0_16_);
                  auVar40 = ZEXT1632(auVar40._0_16_);
                  (*p_Var7)(&local_12a0);
                }
                auVar8 = vpcmpeqd_avx2(local_1260,_DAT_01f7b000);
                auVar33 = vpcmpeqd_avx2(auVar40,auVar40);
                auVar26 = auVar8 ^ auVar33;
                auVar37 = vpcmpeqd_avx2(auVar37,auVar37);
                auVar33 = auVar33 & ~auVar8;
                if ((((((((auVar33 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar33 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar33 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar33 >> 0x7f,0) != '\0') ||
                      (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar33 >> 0xbf,0) != '\0') ||
                    (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar33[0x1f] < '\0') {
                  auVar8 = auVar8 ^ auVar37;
                  auVar33 = vmaskmovps_avx(auVar8,*(undefined1 (*) [32])local_12a0.hit);
                  *(undefined1 (*) [32])(local_12a0.ray + 0x180) = auVar33;
                  auVar33 = vmaskmovps_avx(auVar8,*(undefined1 (*) [32])(local_12a0.hit + 0x20));
                  *(undefined1 (*) [32])(local_12a0.ray + 0x1a0) = auVar33;
                  auVar33 = vmaskmovps_avx(auVar8,*(undefined1 (*) [32])(local_12a0.hit + 0x40));
                  *(undefined1 (*) [32])(local_12a0.ray + 0x1c0) = auVar33;
                  auVar33 = vmaskmovps_avx(auVar8,*(undefined1 (*) [32])(local_12a0.hit + 0x60));
                  *(undefined1 (*) [32])(local_12a0.ray + 0x1e0) = auVar33;
                  auVar33 = vmaskmovps_avx(auVar8,*(undefined1 (*) [32])(local_12a0.hit + 0x80));
                  *(undefined1 (*) [32])(local_12a0.ray + 0x200) = auVar33;
                  auVar33 = vpmaskmovd_avx2(auVar8,*(undefined1 (*) [32])(local_12a0.hit + 0xa0));
                  *(undefined1 (*) [32])(local_12a0.ray + 0x220) = auVar33;
                  auVar33 = vpmaskmovd_avx2(auVar8,*(undefined1 (*) [32])(local_12a0.hit + 0xc0));
                  *(undefined1 (*) [32])(local_12a0.ray + 0x240) = auVar33;
                  auVar33 = vpmaskmovd_avx2(auVar8,*(undefined1 (*) [32])(local_12a0.hit + 0xe0));
                  *(undefined1 (*) [32])(local_12a0.ray + 0x260) = auVar33;
                  auVar33 = vpmaskmovd_avx2(auVar8,*(undefined1 (*) [32])(local_12a0.hit + 0x100));
                  *(undefined1 (*) [32])(local_12a0.ray + 0x280) = auVar33;
                }
              }
              if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar26 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar26 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar26 >> 0x7f,0) == '\0') &&
                    (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar26 >> 0xbf,0) == '\0') &&
                  (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar26[0x1f]) {
                *(undefined4 *)(ray + k * 4 + 0x100) = local_12e0._0_4_;
              }
              else {
                local_12e0 = ZEXT416(*(uint *)(ray + k * 4 + 0x100));
              }
              *(undefined4 *)(local_1300 + local_12c8 * 4) = 0;
              auVar27 = ZEXT1664(local_12e0);
              uVar12 = local_12e0._0_4_;
              auVar25._4_4_ = uVar12;
              auVar25._0_4_ = uVar12;
              auVar25._8_4_ = uVar12;
              auVar25._12_4_ = uVar12;
              auVar47 = ZEXT1664(local_1240);
              auVar28 = vcmpps_avx(local_1240,auVar25,2);
              local_1300 = vandps_avx(auVar28,local_1300);
              auVar72 = ZEXT1664(local_1230);
              uVar21 = local_12c8;
              pSVar17 = local_12e8;
              uVar20 = local_12c0;
            }
            if ((((local_1300 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                 (local_1300 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (local_1300 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                -1 < local_1300[0xf]) break;
            auVar32._8_4_ = 0x7f800000;
            auVar32._0_8_ = 0x7f8000007f800000;
            auVar32._12_4_ = 0x7f800000;
            auVar28 = vblendvps_avx(auVar32,auVar47._0_16_,local_1300);
            auVar34 = vshufps_avx(auVar28,auVar28,0xb1);
            auVar34 = vminps_avx(auVar34,auVar28);
            auVar38 = vshufpd_avx(auVar34,auVar34,1);
            auVar34 = vminps_avx(auVar38,auVar34);
            auVar34 = vcmpps_avx(auVar28,auVar34,0);
            auVar38 = local_1300 & auVar34;
            auVar28 = local_1300;
            if ((((auVar38 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar38 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar38 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar38[0xf] < '\0') {
              auVar28 = vandps_avx(auVar34,local_1300);
            }
            uVar12 = vmovmskps_avx(auVar28);
            local_12c8 = 0;
            for (uVar21 = CONCAT44((int)(uVar21 >> 0x20),uVar12); (uVar21 & 1) == 0;
                uVar21 = uVar21 >> 1 | 0x8000000000000000) {
              local_12c8 = local_12c8 + 1;
            }
          } while( true );
        }
      }
      auVar47 = ZEXT1664(local_11c0);
      auVar52 = ZEXT1664(local_11d0);
      auVar54 = ZEXT1664(local_11f0);
      auVar59 = ZEXT1664(local_1200);
      auVar62 = ZEXT1664(local_1210);
      auVar65 = ZEXT1664(local_1220);
    }
    uVar12 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar27 = ZEXT1664(CONCAT412(uVar12,CONCAT48(uVar12,CONCAT44(uVar12,uVar12))));
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }